

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
copy_str<char8_t,char8_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
          (char8_t *begin,char8_t *end,back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out)

{
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *this;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_38;
  char8_t local_29;
  char8_t *local_28;
  char8_t *end_local;
  char8_t *begin_local;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out_local;
  
  local_28 = end;
  end_local = begin;
  begin_local = (char8_t *)out.container;
  while (end_local != local_28) {
    local_29 = *end_local;
    end_local = end_local + 1;
    local_38 = std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator++
                         ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *)&begin_local,0)
    ;
    this = std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator*(&local_38);
    std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator=(this,&local_29);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)(buffer<char8_t> *)begin_local;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}